

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

mem_hash_record *
MemHashNewRecord(mem_hash_kv_engine *pEngine,void *pKey,int nKey,void *pData,unqlite_int64 nData,
                sxu32 nHash)

{
  SyMemBackend *pBackend;
  mem_hash_record *pChunk;
  void *pDest;
  
  pBackend = &pEngine->sAlloc;
  pChunk = (mem_hash_record *)SyMemBackendAlloc(pBackend,nKey + 0x50);
  if (pChunk != (mem_hash_record *)0x0) {
    pDest = SyMemBackendAlloc(pBackend,(sxu32)nData);
    if (pDest != (void *)0x0) {
      SyZero(pChunk,0x50);
      pChunk->pEngine = pEngine;
      pChunk->nDataLen = (sxu32)nData;
      pChunk->nKeyLen = nKey;
      pChunk->nHash = nHash;
      SyMemcpy(pKey,pChunk + 1,nKey);
      pChunk->pKey = pChunk + 1;
      SyMemcpy(pData,pDest,pChunk->nDataLen);
      pChunk->pData = pDest;
      return pChunk;
    }
    SyMemBackendFree(pBackend,pChunk);
  }
  return (mem_hash_record *)0x0;
}

Assistant:

static mem_hash_record * MemHashNewRecord(
	mem_hash_kv_engine *pEngine,
	const void *pKey,int nKey,
	const void *pData,unqlite_int64 nData,
	sxu32 nHash
	)
{
	SyMemBackend *pAlloc = &pEngine->sAlloc;
	mem_hash_record *pRecord;
	void *pDupData;
	sxu32 nByte;
	char *zPtr;
	
	/* Total number of bytes to alloc */
	nByte = sizeof(mem_hash_record) + nKey;
	/* Allocate a new instance */
	pRecord = (mem_hash_record *)SyMemBackendAlloc(pAlloc,nByte);
	if( pRecord == 0 ){
		return 0;
	}
	pDupData = (void *)SyMemBackendAlloc(pAlloc,(sxu32)nData);
	if( pDupData == 0 ){
		SyMemBackendFree(pAlloc,pRecord);
		return 0;
	}
	zPtr = (char *)pRecord;
	zPtr += sizeof(mem_hash_record);
	/* Zero the structure */
	SyZero(pRecord,sizeof(mem_hash_record));
	/* Fill in the structure */
	pRecord->pEngine = pEngine;
	pRecord->nDataLen = (sxu32)nData;
	pRecord->nKeyLen = (sxu32)nKey;
	pRecord->nHash = nHash;
	SyMemcpy(pKey,zPtr,pRecord->nKeyLen);
	pRecord->pKey = (const void *)zPtr;
	SyMemcpy(pData,pDupData,pRecord->nDataLen);
	pRecord->pData = pDupData;
	/* All done */
	return pRecord;
}